

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandTestScorr(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  uint fFfNdOnly;
  Abc_Ntk_t *pNtk;
  char *pcVar3;
  char *pcVar4;
  uint fVerbose;
  int iVar5;
  uint fNewAlgo;
  uint fFlopOnly;
  uint local_48;
  uint local_44;
  
  fNewAlgo = 0;
  Extra_UtilGetoptReset();
  local_44 = 0xffffffff;
  local_48 = 100;
  fFlopOnly = 0;
  fFfNdOnly = 0;
  fVerbose = 0;
  do {
    while( true ) {
      while (iVar1 = Extra_UtilGetopt(argc,argv,"CSnfsvh"), iVar5 = globalUtilOptind, iVar1 == 0x76)
      {
        fVerbose = fVerbose ^ 1;
      }
      if (iVar1 < 0x66) break;
      if (iVar1 == 0x66) {
        fFlopOnly = fFlopOnly ^ 1;
      }
      else if (iVar1 == 0x6e) {
        fNewAlgo = fNewAlgo ^ 1;
      }
      else {
        if (iVar1 != 0x73) goto LAB_0026808e;
        fFfNdOnly = fFfNdOnly ^ 1;
      }
    }
    if (iVar1 == -1) {
      if (globalUtilOptind + 2 == argc) {
        if ((fFlopOnly == 0) || (fFfNdOnly == 0)) {
          pNtk = Abc_NtkTestScorr(argv[globalUtilOptind],argv[(long)globalUtilOptind + 1],local_44,
                                  local_48,fNewAlgo,fFlopOnly,fFfNdOnly,fVerbose);
          if (pNtk != (Abc_Ntk_t *)0x0) {
            Abc_FrameReplaceCurrentNetwork(pAbc,pNtk);
            return 0;
          }
          pcVar3 = "Sequential sweeping has failed.\n";
          iVar5 = -1;
          goto LAB_002681b5;
        }
        pcVar3 = "These two options (-f and -s) are incompatible.\n";
      }
      else {
        pcVar3 = "Expecting two files names on the command line.\n";
      }
LAB_00268082:
      Abc_Print(-1,pcVar3);
      break;
    }
    if (iVar1 == 0x43) {
      if (argc <= globalUtilOptind) {
        pcVar3 = "Command line switch \"-C\" should be followed by an integer.\n";
        goto LAB_00268082;
      }
      uVar2 = atoi(argv[globalUtilOptind]);
      local_48 = uVar2;
    }
    else {
      if (iVar1 != 0x53) break;
      if (argc <= globalUtilOptind) {
        pcVar3 = "Command line switch \"-S\" should be followed by an integer.\n";
        goto LAB_00268082;
      }
      uVar2 = atoi(argv[globalUtilOptind]);
      local_44 = uVar2;
    }
    globalUtilOptind = iVar5 + 1;
  } while (-1 < (int)uVar2);
LAB_0026808e:
  Abc_Print(-2,"usage: testscorr [-CS num] [-nfsvh] <file_in> <file_out>\n");
  Abc_Print(-2,"\t             outputs the list of sequential equivalences into a file\n");
  Abc_Print(-2,
            "\t             (if <file_in> is in BENCH, init state file should be the same directory)\n"
           );
  Abc_Print(-2,"\t-C num     : limit on the number of conflicts [default = %d]\n",(ulong)local_48);
  Abc_Print(-2,
            "\t-S num     : limit on refinement iterations (-1=no limit, 0=after BMC, etc) [default = %d]\n"
            ,(ulong)local_44);
  pcVar3 = "&scorr";
  if (fNewAlgo == 0) {
    pcVar3 = "scorr";
  }
  Abc_Print(-2,"\t-n         : toggle between \"scorr\" and \"&scorr\" [default = %s]\n",pcVar3);
  pcVar4 = "yes";
  pcVar3 = "yes";
  if (fFlopOnly == 0) {
    pcVar3 = "no";
  }
  Abc_Print(-2,"\t-f         : toggle reporting only flop/flop equivs [default = %s]\n",pcVar3);
  pcVar3 = "yes";
  if (fFfNdOnly == 0) {
    pcVar3 = "no";
  }
  Abc_Print(-2,
            "\t-s         : toggle reporting only flop/flop and flop/node equivs [default = %s]\n",
            pcVar3);
  if (fVerbose == 0) {
    pcVar4 = "no";
  }
  Abc_Print(-2,"\t-v         : toggle verbose output [default = %s]\n",pcVar4);
  Abc_Print(-2,"\t-h         : print the command usage\n");
  Abc_Print(-2,"\t<file_in>  : input file with design for sequential equivalence computation\n");
  pcVar3 = "\t<file_out> : output file with the list of pairs of equivalent signals\n";
  iVar5 = -2;
LAB_002681b5:
  Abc_Print(iVar5,pcVar3);
  return 1;
}

Assistant:

int Abc_CommandTestScorr( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Abc_Ntk_t * Abc_NtkTestScorr( char * pFileNameIn, char * pFileNameOut, int nStepsMax, int nBTLimit, int fNewAlgo, int fFlopOnly, int fFfNdOnly, int fVerbose );

    Abc_Ntk_t * pNtkRes;
    int c;
    int nConfMax;
    int nStepsMax;
    int fNewAlgo;
    int fFlopOnly;
    int fFfNdOnly;
    int fVerbose;
    // set defaults
    nConfMax  = 100;
    nStepsMax =  -1;
    fNewAlgo  =   0;
    fFlopOnly =   0;
    fFfNdOnly =   0;
    fVerbose  =   0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "CSnfsvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            nConfMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nConfMax < 0 )
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by an integer.\n" );
                goto usage;
            }
            nStepsMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nStepsMax < 0 )
                goto usage;
            break;
        case 'n':
            fNewAlgo ^= 1;
            break;
        case 'f':
            fFlopOnly ^= 1;
            break;
        case 's':
            fFfNdOnly ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        default:
            goto usage;
        }
    }
    if ( argc != globalUtilOptind + 2 )
    {
        Abc_Print( -1, "Expecting two files names on the command line.\n" );
        goto usage;
    }
    if ( fFlopOnly && fFfNdOnly )
    {
        Abc_Print( -1, "These two options (-f and -s) are incompatible.\n" );
        goto usage;
    }
    // get the new network
    pNtkRes = Abc_NtkTestScorr( argv[globalUtilOptind], argv[globalUtilOptind+1], nStepsMax, nConfMax, fNewAlgo, fFlopOnly, fFfNdOnly, fVerbose );
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "Sequential sweeping has failed.\n" );
        return 1;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: testscorr [-CS num] [-nfsvh] <file_in> <file_out>\n" );
    Abc_Print( -2, "\t             outputs the list of sequential equivalences into a file\n" );
    Abc_Print( -2, "\t             (if <file_in> is in BENCH, init state file should be the same directory)\n" );
    Abc_Print( -2, "\t-C num     : limit on the number of conflicts [default = %d]\n", nConfMax );
    Abc_Print( -2, "\t-S num     : limit on refinement iterations (-1=no limit, 0=after BMC, etc) [default = %d]\n", nStepsMax );
    Abc_Print( -2, "\t-n         : toggle between \"scorr\" and \"&scorr\" [default = %s]\n", fNewAlgo? "&scorr": "scorr" );
    Abc_Print( -2, "\t-f         : toggle reporting only flop/flop equivs [default = %s]\n", fFlopOnly? "yes": "no" );
    Abc_Print( -2, "\t-s         : toggle reporting only flop/flop and flop/node equivs [default = %s]\n", fFfNdOnly? "yes": "no" );
    Abc_Print( -2, "\t-v         : toggle verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h         : print the command usage\n");
    Abc_Print( -2, "\t<file_in>  : input file with design for sequential equivalence computation\n");
    Abc_Print( -2, "\t<file_out> : output file with the list of pairs of equivalent signals\n");
    return 1;
}